

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gesture_acts.cpp
# Opt level: O2

ostream * operator<<(ostream *os,datarow *dr)

{
  ostream *poVar1;
  
  std::operator<<(os,"datarow<ACC(");
  poVar1 = std::ostream::_M_insert<double>(dr->acc_x);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>(dr->acc_y);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>(dr->acc_z);
  std::operator<<(poVar1,"), GYR(");
  poVar1 = std::ostream::_M_insert<double>(dr->gyr_x);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>(dr->gyr_y);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>(dr->gyr_z);
  poVar1 = std::operator<<(poVar1,"), t(");
  poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
  std::operator<<(poVar1,")>");
  return os;
}

Assistant:

ostream &operator<<(ostream &os, const datarow &dr){
    os << "datarow<ACC(" << dr.acc_x << ", " << dr.acc_y << ", " << dr.acc_z << "), GYR("
       << dr.gyr_x << ", " << dr.gyr_y << ", " << dr.gyr_z << "), t(" << dr.timestamp << ")>";
    return os;
}